

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v11::detail::count_digits_fallback<unsigned__int128>(unsigned___int128 n)

{
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined1 auVar1 [16];
  int count;
  int local_2c;
  ulong local_28;
  long local_20;
  
  auVar1._8_8_ = in_RSI;
  auVar1._0_8_ = in_RDI;
  local_2c = 1;
  while( true ) {
    local_20 = auVar1._8_8_;
    local_28 = auVar1._0_8_;
    if (local_20 == 0 && (ulong)(9 < local_28) <= (ulong)-local_20) {
      return local_2c;
    }
    if (local_20 == 0 && (ulong)(99 < local_28) <= (ulong)-local_20) {
      return local_2c + 1;
    }
    if (local_20 == 0 && (ulong)(999 < local_28) <= (ulong)-local_20) {
      return local_2c + 2;
    }
    if (local_20 == 0 && (ulong)(9999 < local_28) <= (ulong)-local_20) break;
    auVar1 = __udivti3(local_28,local_20,10000,0);
    local_2c = local_2c + 4;
  }
  return local_2c + 3;
}

Assistant:

FMT_CONSTEXPR auto count_digits_fallback(T n) -> int {
  int count = 1;
  for (;;) {
    // Integer division is slow so do it for a group of four digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    if (n < 10) return count;
    if (n < 100) return count + 1;
    if (n < 1000) return count + 2;
    if (n < 10000) return count + 3;
    n /= 10000u;
    count += 4;
  }
}